

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  PlatformInterface *pPVar1;
  Deleter<vk::VkInstance_s_*> **ppDVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  VkAllocationCallbacks *pVVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  Parameters *pPVar10;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  AllocationCallbackRecorder resCallbacks;
  undefined1 local_9c0 [16];
  VkAllocationCallbacks *local_9b0;
  undefined8 local_9a0;
  Environment local_998;
  AllocationCallbackRecorder local_960;
  AllocationCallbackRecorder local_900;
  Resources local_8a0;
  EnvClone local_6e8;
  
  local_9a0 = param_3;
  pVVar7 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_900,pVVar7,0x80);
  pPVar1 = context->m_platformInterface;
  pDVar8 = Context::getDeviceInterface(context);
  pVVar9 = Context::getDevice(context);
  local_998.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_998.programBinaries = context->m_progCollection;
  local_998.allocationCallbacks =
       &local_900.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_998.maxResourceConsumers = 1;
  local_998.vkp = pPVar1;
  local_998.vkd = pDVar8;
  local_998.device = pVVar9;
  iVar6 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  pPVar10 = (Parameters *)((ulong)(iVar6 - 1U) | 0x300000000);
  local_8a0.instance._0_8_ = pPVar10;
  EnvClone::EnvClone(&local_6e8,&local_998,(Parameters *)&local_8a0,iVar6 - 1U);
  Device::Resources::Resources(&local_8a0,&local_6e8.env,(Parameters *)&local_9a0);
  pVVar7 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_960,pVVar7,0x80);
  Device::create((Move<vk::VkDevice_s_*> *)local_9c0,
                 (Environment *)
                 &local_960.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,&local_8a0,
                 pPVar10);
  pVVar7 = local_9b0;
  uVar4 = local_9c0._8_8_;
  uVar3 = local_9c0._0_8_;
  bVar5 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_960,0x1e);
  if (bVar5) {
    if ((VkDevice)uVar3 != (VkDevice)0x0) {
      (*(code *)uVar4)((VkDevice)uVar3,pVVar7);
    }
    bVar5 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_960,0);
    if (bVar5) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_960);
      ::vk::InstanceDriver::~InstanceDriver(&local_8a0.vki);
      if (local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
                   local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
                   m_allocator);
      }
      ::vk::DeviceDriver::~DeviceDriver(&local_6e8.vkd);
      if (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_6e8.deviceRes.vki);
      if (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      bVar5 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_900,0);
      ppDVar2 = (Deleter<vk::VkInstance_s_*> **)
                &local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                 deleter;
      local_6e8.deviceRes.instance._0_8_ = ppDVar2;
      if (bVar5) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"Ok","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6e8.deviceRes.instance._0_8_,
                   local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6e8.deviceRes.instance._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6e8,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6e8.deviceRes.instance._0_8_,
                   local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6e8.deviceRes.instance._0_8_);
      }
      if ((Deleter<vk::VkInstance_s_*> **)local_6e8.deviceRes.instance._0_8_ != ppDVar2) {
        operator_delete((void *)local_6e8.deviceRes.instance._0_8_,
                        (ulong)(local_6e8.deviceRes.instance.object.
                                super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance +
                               1));
      }
      goto LAB_00413965;
    }
    local_9c0._0_8_ = (VkDevice)&local_9b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9c0,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_9c0._0_8_,
               (DestroyDeviceFunc)(local_9c0._8_8_ + local_9c0._0_8_));
    if ((VkDevice)local_9c0._0_8_ != (VkDevice)&local_9b0) {
      operator_delete((void *)local_9c0._0_8_,(ulong)((long)&local_9b0->pUserData + 1));
    }
  }
  else {
    local_9c0._0_8_ = (VkDevice)&local_9b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_9c0,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_9c0._0_8_,
               (DestroyDeviceFunc)(local_9c0._8_8_ + local_9c0._0_8_));
    if ((VkDevice)local_9c0._0_8_ != (VkDevice)&local_9b0) {
      operator_delete((void *)local_9c0._0_8_,(ulong)((long)&local_9b0->pUserData + 1));
    }
    if ((VkDevice)uVar3 != (VkDevice)0x0) {
      (*(code *)uVar4)((VkDevice)uVar3,pVVar7);
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_960);
  ::vk::InstanceDriver::~InstanceDriver(&local_8a0.vki);
  if (local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_8a0.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  ::vk::DeviceDriver::~DeviceDriver(&local_6e8.vkd);
  if (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_6e8.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_6e8.deviceRes.vki);
  if (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6e8.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
LAB_00413965:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_900);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}